

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReaderAnySize(ListReader *__return_storage_ptr__,OrphanBuilder *this)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  StructPointerCount SVar3;
  StructDataBitCount SVar4;
  CapTableReader *pCVar5;
  ReadLimiter *pRVar6;
  word *pwVar7;
  Arena *pAVar8;
  size_t sVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  ulong uVar12;
  undefined4 extraout_var_00;
  SegmentReader **ppSVar13;
  ElementSize EVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  char *condition;
  ulong uVar18;
  SegmentBuilder **ppSVar19;
  OrphanBuilder *pOVar20;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  bool bVar21;
  SegmentBuilder *local_68;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  SegmentReader *newSegment;
  Fault f_2;
  
  local_68 = this->segment;
  pCVar5 = &this->capTable->super_CapTableReader;
  ppSVar19 = (SegmentBuilder **)this->location;
  uVar11 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) == 0 && uVar11 == 0) goto LAB_001252c3;
  if ((uVar11 & 3) == 2 && local_68 != (SegmentBuilder *)0x0) {
    iVar10 = (*((local_68->super_SegmentReader).arena)->_vptr_Arena[2])();
    local_68 = (SegmentBuilder *)CONCAT44(extraout_var,iVar10);
    _kjCondition.right = (void *)0x0;
    _kjCondition.op.content.ptr = " != ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = local_68 != (SegmentBuilder *)0x0;
    if (local_68 == (SegmentBuilder *)0x0) {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      _kjCondition.left = (SegmentReader **)&local_68;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x244,FAILED,"segment != nullptr",
                 "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
                 (char (*) [49])"Message contains far pointer to unknown segment.");
    }
    else {
      uVar11 = (uint)(this->tag).content;
      uVar18 = (ulong)(uVar11 >> 3);
      uVar12 = (local_68->super_SegmentReader).ptr.size_;
      if ((long)uVar12 < (long)uVar18) {
        uVar18 = uVar12;
      }
      uVar15 = 2 - (ulong)((uVar11 & 4) == 0);
      _kjCondition.left = (SegmentReader **)&local_68;
      if (uVar15 + uVar18 <= uVar12) {
        pOVar20 = (OrphanBuilder *)((local_68->super_SegmentReader).ptr.ptr + uVar18);
        pRVar6 = (local_68->super_SegmentReader).readLimiter;
        uVar12 = pRVar6->limit;
        if (uVar15 <= uVar12) {
          pRVar6->limit = uVar12 - uVar15;
          if (((this->tag).content & 4) != 0) {
            pAVar8 = (local_68->super_SegmentReader).arena;
            _kjCondition.left = (SegmentReader **)&local_68;
            iVar10 = (*pAVar8->_vptr_Arena[2])
                               (pAVar8,(ulong)*(uint *)((long)&(pOVar20->tag).content + 4));
            newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar10);
            _kjCondition.left = &newSegment;
            _kjCondition.right = (void *)0x0;
            _kjCondition.op.content.ptr = " != ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = (SegmentBuilder *)newSegment != (SegmentBuilder *)0x0;
            if ((SegmentBuilder *)newSegment == (SegmentBuilder *)0x0) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                        (&f_2,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0x25f,FAILED,"newSegment != nullptr",
                         "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                         &_kjCondition,
                         (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_00125237:
              ppSVar19 = (SegmentBuilder **)0x0;
              kj::_::Debug::Fault::~Fault(&f_2);
            }
            else {
              uVar11 = (uint)(pOVar20->tag).content & 3;
              _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar11);
              _kjCondition.right = anon_var_dwarf_1d37f;
              _kjCondition.op.content.ptr = (char *)0x5;
              _kjCondition.op.content.size_ = (size_t)(uVar11 == 2);
              if (uVar11 != 2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                          (&f_2,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                           ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                           "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                           (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind>
                            *)&_kjCondition,
                           (char (*) [51])"Second word of double-far pad must be far pointer.");
                goto LAB_00125237;
              }
              uVar12 = (ulong)((uint)(pOVar20->tag).content >> 3);
              sVar9 = (((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.size_;
              if ((long)sVar9 < (long)uVar12) {
                uVar12 = sVar9;
              }
              ppSVar19 = (SegmentBuilder **)
                         ((((SegmentBuilder *)newSegment)->super_SegmentReader).ptr.ptr + uVar12);
              local_68 = (SegmentBuilder *)newSegment;
            }
            this = (OrphanBuilder *)&pOVar20->segment;
            goto LAB_00124d67;
          }
          ppSVar1 = &pOVar20->segment;
          uVar11 = (uint)(pOVar20->tag).content;
          lVar17 = (long)((int)uVar11 >> 2);
          this = pOVar20;
          if ((local_68 != (SegmentBuilder *)0x0) &&
             ((pwVar7 = (local_68->super_SegmentReader).ptr.ptr,
              ppSVar19 = (SegmentBuilder **)(pwVar7 + (local_68->super_SegmentReader).ptr.size_),
              lVar17 < (long)pwVar7 - (long)ppSVar1 >> 3 ||
              ((long)ppSVar19 - (long)ppSVar1 >> 3 < lVar17)))) goto LAB_00124d67;
          ppSVar19 = ppSVar1 + lVar17;
          goto LAB_00124d74;
        }
        _kjCondition.left = (SegmentReader **)&local_68;
        (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
      }
      newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
      this_00 = &_kjCondition;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                 ,(DebugExpression<bool> *)&newSegment,
                 (char (*) [318])
                 "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                );
    }
  }
  else {
LAB_00124d67:
    if (ppSVar19 == (SegmentBuilder **)0x0) goto LAB_001252c3;
    uVar11 = (uint)(this->tag).content;
LAB_00124d74:
    uVar11 = uVar11 & 3;
    _kjCondition.left = (SegmentReader **)CONCAT44(1,uVar11);
    _kjCondition.right = anon_var_dwarf_1d37f;
    _kjCondition.op.content.ptr = (char *)0x5;
    _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar11 == 1);
    if (uVar11 == 1) {
      uVar11 = *(uint *)((long)&(this->tag).content + 4);
      EVar14 = (ElementSize)uVar11 & INLINE_COMPOSITE;
      if (EVar14 == INLINE_COMPOSITE) {
        f_2.exception._0_4_ = uVar11 >> 3;
        if (local_68 == (SegmentBuilder *)0x0) {
LAB_00125059:
          uVar11 = *(uint *)ppSVar19 & 3;
          _kjCondition.left = (SegmentReader **)(ulong)uVar11;
          _kjCondition.right = anon_var_dwarf_1d37f;
          _kjCondition.op.content.ptr = (char *)0x5;
          _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar11 == 0);
          if (uVar11 == 0) {
            uVar11 = *(uint *)ppSVar19 >> 2 & 0x1fffffff;
            uVar12 = (ulong)uVar11;
            uVar16 = (uint)*(ushort *)((long)ppSVar19 + 6) + (uint)*(ushort *)((long)ppSVar19 + 4);
            _kjCondition.left = (SegmentReader **)(uVar16 * uVar12);
            _kjCondition.right = &f_2;
            _kjCondition.op.content.ptr = " <= ";
            ppSVar13 = (SegmentReader **)(ulong)(uint)f_2.exception;
            _kjCondition.op.content.size_ = 5;
            bVar21 = (long)_kjCondition.left - (long)ppSVar13 == 0;
            _kjCondition.result = _kjCondition.left < ppSVar13 || bVar21;
            if (_kjCondition.left < ppSVar13 || bVar21) {
              if (uVar16 == 0) {
                if (local_68 == (SegmentBuilder *)0x0) {
                  local_68 = (SegmentBuilder *)0x0;
                }
                else {
                  pRVar6 = (local_68->super_SegmentReader).readLimiter;
                  uVar18 = pRVar6->limit;
                  if (uVar18 < uVar12) {
                    asListReaderAnySize();
                    goto LAB_001252c3;
                  }
                  pRVar6->limit = uVar18 - uVar12;
                }
              }
              uVar2 = *(ushort *)((long)ppSVar19 + 4);
              SVar3 = *(StructPointerCount *)((long)ppSVar19 + 6);
              __return_storage_ptr__->segment = &local_68->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar5;
              __return_storage_ptr__->ptr = (byte *)(ppSVar19 + 1);
              __return_storage_ptr__->elementCount = uVar11;
              __return_storage_ptr__->step = uVar16 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = SVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_00125323:
              __return_storage_ptr__->nestingLimit = 0x7ffffffe;
              return __return_storage_ptr__;
            }
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int&>&,char_const(&)[57]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x90f,FAILED,"upgradeBound<uint64_t>(size) * wordsPerElement <= wordCount",
                       "_kjCondition,\"INLINE_COMPOSITE list\'s elements overrun its word count.\"",
                       (DebugComparison<unsigned_long,_unsigned_int_&> *)&_kjCondition,
                       (char (*) [57])"INLINE_COMPOSITE list\'s elements overrun its word count.");
          }
          else {
            this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[61]>
                      ((Fault *)this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                       ,0x907,FAILED,"tag->kind() == WirePointer::STRUCT",
                       "_kjCondition,\"INLINE_COMPOSITE lists of non-STRUCT type are not supported.\""
                       ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *
                        )&_kjCondition,
                       (char (*) [61])"INLINE_COMPOSITE lists of non-STRUCT type are not supported."
                      );
          }
        }
        else {
          if (((long)ppSVar19 - (long)(local_68->super_SegmentReader).ptr.ptr >> 3) +
              (ulong)(uint)f_2.exception + 1 <= (local_68->super_SegmentReader).ptr.size_) {
            uVar12 = (ulong)(uint)f_2.exception + 1;
            pRVar6 = (local_68->super_SegmentReader).readLimiter;
            uVar18 = pRVar6->limit;
            if (uVar12 <= uVar18) {
              pRVar6->limit = uVar18 - uVar12;
              goto LAB_00125059;
            }
            (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          condition = "boundsCheck(segment, ptr, wordCount + POINTER_SIZE_IN_WORDS)";
          iVar10 = 0x900;
LAB_00124f93:
          newSegment = (SegmentReader *)((ulong)newSegment & 0xffffffffffffff00);
          this_00 = &_kjCondition;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[319]>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,iVar10,FAILED,condition,
                     "_kjCondition,\"Message contains out-of-bounds list pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
                     ,(DebugExpression<bool> *)&newSegment,
                     (char (*) [319])
                     "Message contains out-of-bounds list pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
                    );
        }
      }
      else {
        SVar4 = *(StructDataBitCount *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar11 & 7) * 4);
        uVar12 = (ulong)(uVar11 >> 3);
        uVar16 = (uint)(EVar14 == POINTER) * 0x40 + SVar4;
        if (local_68 != (SegmentBuilder *)0x0) {
          uVar18 = uVar16 * uVar12 + 0x3f >> 6 & 0xffffffff;
          if (((long)ppSVar19 - (long)(local_68->super_SegmentReader).ptr.ptr >> 3) + uVar18 <=
              (local_68->super_SegmentReader).ptr.size_) {
            pRVar6 = (local_68->super_SegmentReader).readLimiter;
            uVar15 = pRVar6->limit;
            if (uVar18 <= uVar15) {
              pRVar6->limit = uVar15 - uVar18;
              goto LAB_001250d8;
            }
            (*((local_68->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          condition = "boundsCheck(segment, ptr, wordCount)";
          iVar10 = 0x958;
          goto LAB_00124f93;
        }
LAB_001250d8:
        if (EVar14 != BIT) {
          if (((int)((ulong)uVar11 & 7) == 0) && (local_68 != (SegmentBuilder *)0x0)) {
            pRVar6 = (local_68->super_SegmentReader).readLimiter;
            uVar18 = pRVar6->limit;
            if (uVar18 < uVar12) {
              asListReaderAnySize();
              goto LAB_001252c3;
            }
            pRVar6->limit = uVar18 - uVar12;
          }
          __return_storage_ptr__->segment = &local_68->super_SegmentReader;
          __return_storage_ptr__->capTable = pCVar5;
          __return_storage_ptr__->ptr = (byte *)ppSVar19;
          __return_storage_ptr__->elementCount = uVar11 >> 3;
          __return_storage_ptr__->step = uVar16;
          __return_storage_ptr__->structDataSize = SVar4;
          __return_storage_ptr__->structPointerCount = (ushort)(EVar14 == POINTER);
          __return_storage_ptr__->elementSize = EVar14;
          goto LAB_00125323;
        }
        this_00 = &_kjCondition;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  ((Fault *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x969,FAILED,(char *)0x0,
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])0x183252);
      }
    }
    else {
      this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[84]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8f3,FAILED,"ref->kind() == WirePointer::LIST",
                 "_kjCondition,\"Schema mismatch: Message contains non-list pointer where list pointer was \" \"expected.\""
                 ,(DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                  &_kjCondition,
                 (char (*) [84])
                 "Schema mismatch: Message contains non-list pointer where list pointer was expected."
                );
    }
  }
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
LAB_001252c3:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 3) = 0;
  __return_storage_ptr__->nestingLimit = 0x7fffffff;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReaderAnySize() const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, ElementSize::VOID /* dummy */,
      kj::maxValue);
}